

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O3

Config * ProgramOptions::parseCommandLine(Config *__return_storage_ptr__,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  __node_base *p_Var2;
  pointer pSVar3;
  Config *pCVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pbVar7;
  undefined8 uVar8;
  __node_base _Var9;
  __node_base_ptr p_Var10;
  long *plVar11;
  Color CVar12;
  int iVar13;
  OptionAdder *pOVar14;
  size_t sVar15;
  runtime_error *this_00;
  ostream *poVar16;
  DataFormat DVar17;
  KerningPairs KVar18;
  code *pcVar19;
  TextureNameSuffix TVar20;
  pointer_____offset_0x10___ *ppuVar21;
  size_type sVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  string *fileName;
  string dataFormat;
  string kerningPairs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  charsFile;
  string textureNameSuffix;
  string charsFileOptionName;
  string chars;
  string textureSizeListOptionName;
  string charsOptionName;
  string backgroundColorOptionName;
  string backgroundColor;
  string textureSizeList;
  string color;
  ParseResult result;
  Options options;
  undefined1 local_1241;
  Config *local_1240;
  string local_1238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_11f8;
  __node_base *local_11f0;
  pointer local_11e8;
  __node_base local_11e0;
  undefined4 uStack_11d8;
  undefined4 uStack_11d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d0;
  uint32_t *local_11b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_11a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_11a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  undefined1 local_1158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1128;
  element_type *local_1118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1110;
  string local_1108;
  string local_10e8;
  string local_10c8;
  string local_10a8;
  string local_1088;
  undefined1 local_1068 [32];
  string local_1048;
  element_type *local_1028;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1020;
  element_type *local_1018;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1010;
  element_type *local_1008;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1000;
  element_type *local_ff8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_ff0;
  element_type *local_fe8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_fe0;
  element_type *local_fd8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_fd0;
  element_type *local_fc8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_fc0;
  element_type *local_fb8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_fb0;
  element_type *local_fa8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_fa0;
  string local_f98;
  element_type *local_f78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f70;
  undefined1 local_f68 [32];
  undefined1 local_f48 [16];
  undefined1 local_f38 [8];
  undefined1 auStack_f30 [12];
  undefined4 uStack_f24;
  bool bStack_f20;
  undefined7 uStack_f1f;
  undefined1 local_f18 [32];
  _Alloc_hider local_ef8;
  size_t sStack_ef0;
  undefined1 auStack_ee8 [16];
  _Alloc_hider _Stack_ed8;
  __node_base local_ed0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_ec8;
  size_t local_eb8;
  __node_base_ptr p_Stack_eb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ea8;
  string local_e88;
  undefined1 local_e68 [32];
  undefined1 local_e48 [16];
  char local_e38 [16];
  undefined1 local_e28 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e08;
  undefined1 local_df8 [16];
  __node_base local_de8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_de0;
  _Hash_node_base local_dd8 [2];
  __node_base_ptr local_dc8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_dc0;
  __node_base local_db8 [2];
  undefined1 local_da8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d68;
  char local_d58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  shared_ptr<const_cxxopts::Value> local_d28;
  string local_d18;
  shared_ptr<const_cxxopts::Value> local_cf8;
  shared_ptr<const_cxxopts::Value> local_ce8;
  shared_ptr<const_cxxopts::Value> local_cd8;
  shared_ptr<const_cxxopts::Value> local_cc8;
  shared_ptr<const_cxxopts::Value> local_cb8;
  shared_ptr<const_cxxopts::Value> local_ca8;
  shared_ptr<const_cxxopts::Value> local_c98;
  shared_ptr<const_cxxopts::Value> local_c88;
  shared_ptr<const_cxxopts::Value> local_c78;
  shared_ptr<const_cxxopts::Value> local_c68;
  shared_ptr<const_cxxopts::Value> local_c58;
  shared_ptr<const_cxxopts::Value> local_c48;
  shared_ptr<const_cxxopts::Value> local_c38;
  shared_ptr<const_cxxopts::Value> local_c28;
  shared_ptr<const_cxxopts::Value> local_c18;
  shared_ptr<const_cxxopts::Value> local_c08;
  shared_ptr<const_cxxopts::Value> local_bf8;
  shared_ptr<const_cxxopts::Value> local_be8;
  shared_ptr<const_cxxopts::Value> local_bd8;
  shared_ptr<const_cxxopts::Value> local_bc8;
  shared_ptr<const_cxxopts::Value> local_bb8;
  shared_ptr<const_cxxopts::Value> local_ba8;
  shared_ptr<const_cxxopts::Value> local_b98;
  undefined1 local_b88 [16];
  shared_ptr<const_cxxopts::Value> local_b78;
  _Base_ptr local_b60;
  Alignment *local_b58;
  string local_b50;
  undefined1 local_b30 [32];
  string local_b10;
  string local_af0;
  undefined1 local_ad0 [32];
  undefined1 local_ab0 [32];
  undefined1 local_a90 [32];
  string local_a70;
  undefined1 local_a50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a30;
  undefined1 local_a20 [16];
  string local_a10;
  undefined1 local_9f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9d0;
  undefined1 local_9c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b0;
  char local_9a0 [16];
  string local_990;
  long *local_970;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_968;
  long local_960 [2];
  string local_950;
  string local_930;
  long *local_910;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_908;
  long local_900 [2];
  string local_8f0;
  string local_8d0;
  long *local_8b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_8a8;
  long local_8a0 [2];
  string local_890;
  string local_870;
  long *local_850;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_848;
  long local_840 [2];
  string local_830;
  string local_810;
  long *local_7f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7e8;
  long local_7e0 [2];
  string local_7d0;
  string local_7b0;
  long *local_790;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_788;
  long local_780 [2];
  string local_770;
  string local_750;
  undefined1 local_730 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_710;
  undefined1 local_700 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  char local_6e0 [16];
  string local_6d0;
  string local_6b0;
  string local_690;
  long *local_670;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_668;
  long local_660 [2];
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  ParseResult local_2f0;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  Options local_1a8;
  
  (__return_storage_ptr__->fontFile)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fontFile).field_2;
  (__return_storage_ptr__->fontFile)._M_string_length = 0;
  (__return_storage_ptr__->fontFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->chars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->backgroundTransparent = true;
  __return_storage_ptr__->fontSize = 0x10;
  (__return_storage_ptr__->padding).up = 0;
  (__return_storage_ptr__->padding).right = 0;
  (__return_storage_ptr__->padding).down = 0;
  (__return_storage_ptr__->padding).left = 0;
  (__return_storage_ptr__->spacing).ver = 0;
  (__return_storage_ptr__->spacing).hor = 0;
  (__return_storage_ptr__->alignment).ver = 1;
  (__return_storage_ptr__->alignment).hor = 1;
  (__return_storage_ptr__->textureSizeList).
  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->textureSizeList).
  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->textureSizeList).
  super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->output).field_2;
  (__return_storage_ptr__->output)._M_string_length = 0;
  (__return_storage_ptr__->output).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->dataFormat = Text;
  __return_storage_ptr__->textureNameSuffix = IndexAligned;
  *(undefined8 *)((long)&__return_storage_ptr__->maxTextureCount + 2) = 0;
  __return_storage_ptr__->kerningPairs = Disabled;
  __return_storage_ptr__->maxTextureCount = 0;
  local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
  local_d48._M_string_length = 0;
  local_d48.field_2._M_local_buf[0] = '\0';
  local_ea8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ea8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_ea8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"background-color","");
  local_d68._M_allocated_capacity = (size_type)local_d58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"chars-file","");
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"chars","");
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  local_b60 = &p_Var1->_M_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"texture-size","");
  local_11d0._M_dataplus._M_p = (pointer)&local_11d0.field_2;
  local_11d0._M_string_length = 0;
  local_11d0.field_2._M_local_buf[0] = '\0';
  local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
  local_1178._M_string_length = 0;
  local_1178.field_2._M_local_buf[0] = '\0';
  local_d88._M_dataplus._M_p = (pointer)&local_d88.field_2;
  local_d88._M_string_length = 0;
  local_d88.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"fontbm","");
  local_1240 = __return_storage_ptr__;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"Command line bitmap font generator, compatible with bmfont","");
  cxxopts::Options::Options(&local_1a8,&local_1d0,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_11f0 = &local_11e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11f0,"");
  local_f38 = (undefined1  [8])local_11e8;
  p_Var2 = &local_2f0.m_keys._M_h._M_before_begin;
  if (local_11f0 == &local_11e0) {
    local_2f0.m_keys._M_h._M_element_count._0_4_ = uStack_11d8;
    local_2f0.m_keys._M_h._M_element_count._4_4_ = uStack_11d4;
    local_11f0 = p_Var2;
  }
  local_11e8 = (pointer)0x0;
  local_11e0._M_nxt._0_4_ = (uint)local_11e0._M_nxt & 0xffffff00;
  local_f48._8_8_ = local_11f0;
  if (local_11f0 == p_Var2) {
    uStack_f24 = local_2f0.m_keys._M_h._M_element_count._4_4_;
    auStack_f30._8_4_ = (undefined4)local_2f0.m_keys._M_h._M_element_count;
    local_f48._8_8_ = (__node_base *)(local_f38 + 8);
  }
  local_2f0.m_keys._M_h._M_buckets = &local_2f0.m_keys._M_h._M_before_begin._M_nxt;
  local_11f0 = &local_11e0;
  local_f48._0_8_ = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"help","");
  local_1138._M_allocated_capacity = (size_type)&local_1128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1138,"produce help message","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_1238,(allocator<cxxopts::values::standard_value<bool>_> *)&local_6f0);
  local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1238._M_dataplus._M_p._0_4_;
  local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1238._M_dataplus._M_p._4_4_;
  local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_1238._M_string_length;
  local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1238._M_string_length._4_4_;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_f48,(string *)&local_2f0,(string *)&local_1138,
                       &local_b78,&local_370);
  local_1238._M_dataplus._M_p = (pointer)&local_1238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1238,"font-file","");
  local_6f0._M_allocated_capacity = (size_type)local_6e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f0,"path to ttf file, required","");
  local_f68._0_8_ = __return_storage_ptr__;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_e48,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_f68);
  local_b88._0_4_ = local_e48._0_4_;
  local_b88._4_4_ = local_e48._4_4_;
  local_b88._8_4_ = local_e48._8_4_;
  local_b88._12_4_ = local_e48._12_4_;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_1238,(string *)&local_6f0,
                       (shared_ptr<const_cxxopts::Value> *)local_b88,&local_390);
  local_e48._0_8_ = local_e38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e48,
             "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if \'chars-file\' option is not defined"
             ,"");
  local_1158._0_8_ = &local_d48;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_f68,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_da8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1158);
  local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_f68._0_4_;
  local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_f68._4_4_;
  local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_f68._8_4_;
  local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_f68._12_4_;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_6b0,(string *)local_e48,&local_b98,&local_3b0);
  local_f68._0_8_ = local_f68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f68,
             "optional path to UTF-8 text file with required characters (will be combined with \'chars\' option)"
             ,"");
  local_da8._0_8_ = &local_ea8;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)local_1158,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_dc8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)local_da8);
  local_ba8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1158._0_4_;
  local_ba8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1158._4_4_;
  local_ba8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_1158._8_4_;
  local_ba8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1158._12_4_;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,(string *)&local_d68,(string *)local_f68,&local_ba8,&local_3d0);
  local_1158._0_8_ = local_1158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1158,"color","");
  local_da8._0_8_ = local_da8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da8,
             "foreground RGB color, for example: 32,255,255, default value is 255,255,255","");
  local_710._M_allocated_capacity = (size_type)&local_310;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_dc8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_f98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &local_710._M_allocated_capacity);
  p_Var10 = local_dc8;
  local_dc8 = local_db8;
  local_1180 = local_dc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc8,"255,255,255","");
  (*(code *)p_Var10->_M_nxt[10]._M_nxt)(&local_f78,p_Var10,&local_dc8);
  local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f78;
  local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_f70;
  local_f78 = (element_type *)0x0;
  p_Stack_f70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,(string *)local_1158,(string *)local_da8,&local_bb8,&local_3f0);
  local_710._M_allocated_capacity = (size_type)local_700;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_710,
             "background color RGB color, for example: 0,0,128, transparent by default","");
  local_730._0_8_ = &local_350;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_f98,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_de8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_730);
  local_bc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_f98._M_dataplus._M_p._0_4_;
  local_bc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_f98._M_dataplus._M_p._4_4_;
  local_bc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_f98._M_string_length;
  local_bc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_f98._M_string_length._4_4_;
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_690,(string *)&local_710,&local_bc8,&local_410);
  local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"font-size","");
  local_730._0_8_ = local_730 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_730,"font size, default value is 32","");
  local_750._M_dataplus._M_p = (pointer)&__return_storage_ptr__->fontSize;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_short>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_short>>,unsigned_short*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_short>,(__gnu_cxx::_Lock_policy)2>
              *)&local_de8,(allocator<cxxopts::values::standard_value<unsigned_short>_> *)&local_770
             ,(unsigned_short **)&local_750);
  _Var9._M_nxt = local_de8._M_nxt;
  local_de8._M_nxt = local_dd8;
  local_1188 = local_de0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_de8,"32","");
  (*(code *)(_Var9._M_nxt)->_M_nxt[10]._M_nxt)(&local_fa8,_Var9._M_nxt,&local_de8);
  local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fa8;
  local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_fa0;
  local_fa8 = (element_type *)0x0;
  p_Stack_fa0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_f98,(string *)local_730,&local_bd8,&local_430);
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"padding-up","");
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_770,"padding up, default value is 0","");
  local_7b0._M_dataplus._M_p = (pointer)&__return_storage_ptr__->padding;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_790,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_7d0,
             (uint **)&local_7b0);
  plVar11 = local_790;
  local_790 = local_780;
  local_1190 = local_788;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"0","");
  (**(code **)(*plVar11 + 0x50))(&local_fb8,plVar11,&local_790);
  local_be8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fb8;
  local_be8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_fb0;
  local_fb8 = (element_type *)0x0;
  p_Stack_fb0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_750,&local_770,&local_be8,&local_450);
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"padding-right","");
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7d0,"padding right, default value is 0","");
  local_810._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->padding).right;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_7f0,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_830,
             (uint **)&local_810);
  plVar11 = local_7f0;
  local_7f0 = local_7e0;
  local_1198 = local_7e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"0","");
  (**(code **)(*plVar11 + 0x50))(&local_fc8,plVar11,&local_7f0);
  local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fc8;
  local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_fc0;
  local_fc8 = (element_type *)0x0;
  p_Stack_fc0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_7b0,&local_7d0,&local_bf8,&local_470);
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"padding-down","");
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_830,"padding down, default value is 0","");
  local_870._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->padding).down;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_850,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_890,
             (uint **)&local_870);
  plVar11 = local_850;
  local_850 = local_840;
  local_11a0 = local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"0","");
  (**(code **)(*plVar11 + 0x50))(&local_fd8,plVar11,&local_850);
  local_c08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fd8;
  local_c08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_fd0;
  local_fd8 = (element_type *)0x0;
  p_Stack_fd0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_810,&local_830,&local_c08,&local_490);
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"padding-left","");
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_890,"padding left, default value is 0","");
  local_8d0._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->padding).left;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_8b0,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_8f0,
             (uint **)&local_8d0);
  plVar11 = local_8b0;
  local_8b0 = local_8a0;
  local_11a8 = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"0","");
  (**(code **)(*plVar11 + 0x50))(&local_fe8,plVar11,&local_8b0);
  local_c18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_fe8;
  local_c18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_fe0;
  local_fe8 = (element_type *)0x0;
  p_Stack_fe0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_870,&local_890,&local_c18,&local_4b0);
  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"spacing-vert","");
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f0,"spacing vert, default value is 0","");
  local_930._M_dataplus._M_p = (pointer)&__return_storage_ptr__->spacing;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_910,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_950,
             (uint **)&local_930);
  plVar11 = local_910;
  local_910 = local_900;
  local_11f8 = local_908;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"0","");
  (**(code **)(*plVar11 + 0x50))(&local_ff8,plVar11,&local_910);
  local_c28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_ff8;
  local_c28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_ff0;
  local_ff8 = (element_type *)0x0;
  p_Stack_ff0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_8d0,&local_8f0,&local_c28,&local_4d0);
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"spacing-horiz","");
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_950,"spacing horiz, default value is 0","");
  local_990._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->spacing).hor;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_970,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_9b0,
             (uint **)&local_990);
  plVar11 = local_970;
  local_970 = local_960;
  local_1200 = local_968;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"0","");
  (**(code **)(*plVar11 + 0x50))(&local_1008,plVar11,&local_970);
  local_c38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1008
  ;
  local_c38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1000;
  local_1008 = (element_type *)0x0;
  p_Stack_1000 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_930,&local_950,&local_c38,&local_4f0);
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"output","");
  local_9b0._M_allocated_capacity = (size_type)local_9a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9b0,"output files name without extension, required","");
  local_9d0._M_allocated_capacity = (size_type)&__return_storage_ptr__->output;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_e68,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_e08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &local_9d0._M_allocated_capacity);
  local_c48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_e68._0_4_;
  local_c48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_e68._4_4_;
  local_c48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_e68._8_4_;
  local_c48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_e68._12_4_;
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_990,(string *)&local_9b0,&local_c48,&local_510);
  local_e68._0_8_ = local_e68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e68,"data-format","");
  local_9d0._M_allocated_capacity = (size_type)local_9c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d0,
             "output data file format: \"txt\", \"xml\", \"json\", \"bin\", \"cbor\", default: \"txt\""
             ,"");
  local_9f0._0_8_ = &local_11d0;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_e08._M_local_buf,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_9f0);
  uVar8 = local_e08._M_allocated_capacity;
  local_e08._M_allocated_capacity = (size_type)local_df8;
  local_1208 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e08._8_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e08,"txt","");
  (**(code **)(*(long *)uVar8 + 0x50))(&local_1018,uVar8,&local_e08);
  local_c58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1018
  ;
  local_c58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1010;
  local_1018 = (element_type *)0x0;
  p_Stack_1010 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,(string *)local_e68,(string *)&local_9d0,&local_c58,&local_530);
  local_9f0._0_8_ = local_9f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f0,"kerning-pairs","");
  local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,
             "\"generate kerning pairs: \"disabled\", \"basic\", \"regular\" (tuned by hinter), \"extended\" (bigger output size, but more precise), default: \"disabled\""
             ,"");
  local_a50._0_8_ = &local_1178;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_a30._M_local_buf,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_a50);
  uVar8 = local_a30._M_allocated_capacity;
  local_a30._M_allocated_capacity = (size_type)local_a20;
  local_1210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a30._8_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"disabled","");
  (**(code **)(*(long *)uVar8 + 0x50))(&local_1028,uVar8,&local_a30);
  local_c68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1028
  ;
  local_c68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1020;
  local_1028 = (element_type *)0x0;
  p_Stack_1020 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,(string *)local_9f0,&local_a10,&local_c68,&local_550);
  local_a50._0_8_ = local_a50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"monochrome","");
  local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"disable anti-aliasing","");
  local_a90._0_8_ = &__return_storage_ptr__->monochrome;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_e88,(allocator<cxxopts::values::standard_value<bool>_> *)&local_1048,
             (bool **)local_a90);
  local_c78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_e88._M_dataplus._M_p._0_4_;
  local_c78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_e88._M_dataplus._M_p._4_4_;
  local_c78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_e88._M_string_length;
  local_c78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_e88._M_string_length._4_4_;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,(string *)local_a50,&local_a70,&local_c78,&local_570);
  local_e88._M_dataplus._M_p = (pointer)&local_e88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e88,"extra-info","");
  local_a90._0_8_ = local_a90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a90,"write extra information to data file","");
  local_1068._0_8_ = &__return_storage_ptr__->extraInfo;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_1048,(allocator<cxxopts::values::standard_value<bool>_> *)local_e28,
             (bool **)local_1068);
  local_c88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1048._M_dataplus._M_p._0_4_;
  local_c88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1048._M_dataplus._M_p._4_4_;
  local_c88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_1048._M_string_length;
  local_c88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1048._M_string_length._4_4_;
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_e88,(string *)local_a90,&local_c88,&local_590);
  local_1048._M_dataplus._M_p = (pointer)&local_1048.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1048,
             "list of texture sizes (will be tried from left to right to fit glyphs)","");
  local_e28._0_8_ = &local_330;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_1068,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1088,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_e28);
  local_c98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1068._0_4_;
  local_c98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1068._4_4_;
  local_c98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_1068._8_4_;
  local_c98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1068._12_4_;
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_6d0,&local_1048,&local_c98,&local_5b0);
  local_1068._0_8_ = local_1068 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1068,"texture-crop-width","");
  local_e28._0_8_ = local_e28 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e28,"crop unused parts of output textures (width)","");
  local_ab0._0_8_ = &__return_storage_ptr__->cropTexturesWidth;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_1088,(allocator<cxxopts::values::standard_value<bool>_> *)&local_10a8,
             (bool **)local_ab0);
  local_ca8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1088._M_dataplus._M_p._0_4_;
  local_ca8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1088._M_dataplus._M_p._4_4_;
  local_ca8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_1088._M_string_length;
  local_ca8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1088._M_string_length._4_4_;
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,(string *)local_1068,(string *)local_e28,&local_ca8,&local_5d0);
  local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1088,"texture-crop-height","");
  local_ab0._0_8_ = local_ab0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ab0,"crop unused parts of output textures (height)","");
  local_ad0._0_8_ = &__return_storage_ptr__->cropTexturesHeight;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_10a8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_10c8,
             (bool **)local_ad0);
  local_cb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_10a8._M_dataplus._M_p._0_4_;
  local_cb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_10a8._M_dataplus._M_p._4_4_;
  local_cb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_10a8._M_string_length;
  local_cb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_10a8._M_string_length._4_4_;
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_1088,(string *)local_ab0,&local_cb8,&local_5f0);
  local_10a8._M_dataplus._M_p = (pointer)&local_10a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10a8,"align-horiz","");
  local_ad0._0_8_ = local_ad0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ad0,"align glyph horizontal position","");
  local_11b0 = &(__return_storage_ptr__->alignment).hor;
  local_af0._M_dataplus._M_p = (pointer)local_11b0;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_10c8,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_10e8
             ,(uint **)&local_af0);
  local_cc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_10c8._M_dataplus._M_p._0_4_;
  local_cc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_10c8._M_dataplus._M_p._4_4_;
  local_cc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_10c8._M_string_length;
  local_cc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_10c8._M_string_length._4_4_;
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_10a8,(string *)local_ad0,&local_cc8,&local_610);
  local_10c8._M_dataplus._M_p = (pointer)&local_10c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10c8,"align-vert","");
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_af0,"align glyph vertical position","");
  local_b58 = &__return_storage_ptr__->alignment;
  local_b10._M_dataplus._M_p = (pointer)local_b58;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_10e8,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_1108
             ,(uint **)&local_b10);
  local_cd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_10e8._M_dataplus._M_p._0_4_;
  local_cd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_10e8._M_dataplus._M_p._4_4_;
  local_cd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_10e8._M_string_length;
  local_cd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_10e8._M_string_length._4_4_;
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_10c8,&local_af0,&local_cd8,&local_630);
  local_10e8._M_dataplus._M_p = (pointer)&local_10e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10e8,"verbose","");
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"verbose output","");
  local_b30._0_8_ = &__return_storage_ptr__->verbose;
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>,bool*>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_1108,(allocator<cxxopts::values::standard_value<bool>_> *)&local_d18,
             (bool **)local_b30);
  local_ce8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1108._M_dataplus._M_p._0_4_;
  local_ce8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_1108._M_dataplus._M_p._4_4_;
  local_ce8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_1108._M_string_length;
  local_ce8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_1108._M_string_length._4_4_;
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"");
  pOVar14 = cxxopts::OptionAdder::operator()(pOVar14,&local_10e8,&local_b10,&local_ce8,&local_650);
  local_1108._M_dataplus._M_p = (pointer)&local_1108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1108,"max-texture-count","");
  local_b30._0_8_ = local_b30 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b30,"maximum generated textures","");
  local_b50._M_dataplus._M_p = (pointer)&__return_storage_ptr__->maxTextureCount;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<unsigned_int>>,unsigned_int*>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_d18,(allocator<cxxopts::values::standard_value<unsigned_int>_> *)&local_670,
             (uint **)&local_b50);
  local_cf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_d18._M_dataplus._M_p._0_4_;
  local_cf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_d18._M_dataplus._M_p._4_4_;
  local_cf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_d18._M_string_length;
  local_cf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_d18._M_string_length._4_4_;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  pOVar14 = cxxopts::OptionAdder::operator()
                      (pOVar14,&local_1108,(string *)local_b30,&local_cf8,&local_210);
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,"texture-name-suffix","");
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b50,
             "texture name suffix: \"index_aligned\", \"index\", \"none\", default: \"index_aligned\""
             ,"");
  local_1b0 = &local_d88;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>,std::__cxx11::string*>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_670,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1241,&local_1b0);
  plVar11 = local_670;
  local_670 = local_660;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"index_aligned","");
  (**(code **)(*plVar11 + 0x50))(&local_1118,plVar11,&local_670);
  local_d28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1118
  ;
  local_d28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_1110;
  local_1118 = (element_type *)0x0;
  p_Stack_1110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
  cxxopts::OptionAdder::operator()(pOVar14,&local_d18,&local_b50,&local_d28,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_d28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1110);
  }
  if (local_670 != local_660) {
    operator_delete(local_670);
  }
  if (local_668 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_668);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p);
  }
  this = local_1180;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p);
  }
  pCVar4 = local_1240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_cf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_cf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_cf8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_cf8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((undefined1 *)local_b30._0_8_ != local_b30 + 0x10) {
    operator_delete((void *)local_b30._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1108._M_dataplus._M_p != &local_1108.field_2) {
    operator_delete(local_1108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_ce8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_ce8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_ce8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_ce8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e8._M_dataplus._M_p != &local_10e8.field_2) {
    operator_delete(local_10e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_cd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_cd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_cd8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_cd8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10c8._M_dataplus._M_p != &local_10c8.field_2) {
    operator_delete(local_10c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_cc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_cc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_cc8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_cc8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((undefined1 *)local_ad0._0_8_ != local_ad0 + 0x10) {
    operator_delete((void *)local_ad0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a8._M_dataplus._M_p != &local_10a8.field_2) {
    operator_delete(local_10a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_cb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_cb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_cb8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_cb8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((undefined1 *)local_ab0._0_8_ != local_ab0 + 0x10) {
    operator_delete((void *)local_ab0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
    operator_delete(local_1088._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_ca8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_ca8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_ca8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_ca8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e28._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e28 + 0x10)) {
    operator_delete((void *)local_e28._0_8_);
  }
  if ((undefined1 *)local_1068._0_8_ != local_1068 + 0x10) {
    operator_delete((void *)local_1068._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_c98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_c98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_c98.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_c98.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1048._M_dataplus._M_p != &local_1048.field_2) {
    operator_delete(local_1048._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_c88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_c88.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_c88.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_c88.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((undefined1 *)local_a90._0_8_ != local_a90 + 0x10) {
    operator_delete((void *)local_a90._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e88._M_dataplus._M_p != &local_e88.field_2) {
    operator_delete(local_e88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_c78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_c78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_c78.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_c78.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a50._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a50 + 0x10)) {
    operator_delete((void *)local_a50._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p);
  }
  if (local_c68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c68.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1020 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1020);
  }
  if ((undefined1 *)local_a30._M_allocated_capacity != local_a20) {
    operator_delete((void *)local_a30._M_allocated_capacity);
  }
  if (local_1210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_9f0 + 0x10)) {
    operator_delete((void *)local_9f0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  if (local_c58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1010 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1010);
  }
  if ((undefined1 *)local_e08._M_allocated_capacity != local_df8) {
    operator_delete((void *)local_e08._M_allocated_capacity);
  }
  if (local_1208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1208);
  }
  if ((undefined1 *)local_9d0._M_allocated_capacity != local_9c0) {
    operator_delete((void *)local_9d0._M_allocated_capacity);
  }
  if ((_Hash_node_base *)local_e68._0_8_ != (_Hash_node_base *)(local_e68 + 0x10)) {
    operator_delete((void *)local_e68._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_c48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_c48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_c48.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_c48.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((char *)local_9b0._M_allocated_capacity != local_9a0) {
    operator_delete((void *)local_9b0._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if (local_c38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_1000 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1000);
  }
  if (local_970 != local_960) {
    operator_delete(local_970);
  }
  if (local_1200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  if (local_c28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_ff0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_ff0);
  }
  if (local_910 != local_900) {
    operator_delete(local_910);
  }
  if (local_11f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
    operator_delete(local_8d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if (local_c18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_fe0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_fe0);
  }
  if (local_8b0 != local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_11a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  if (local_c08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_fd0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_fd0);
  }
  if (local_850 != local_840) {
    operator_delete(local_850);
  }
  if (local_11a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if (local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_fc0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_fc0);
  }
  if (local_7f0 != local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_1198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if (local_be8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_be8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_fb0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_fb0);
  }
  if (local_790 != local_780) {
    operator_delete(local_790);
  }
  if (local_1190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_fa0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_fa0);
  }
  if (local_de8._M_nxt != local_dd8) {
    operator_delete(local_de8._M_nxt);
  }
  if (local_1188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1188);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_730 + 0x10)) {
    operator_delete((void *)local_730._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
    operator_delete(local_f98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_bc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_bc8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_bc8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_bc8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((undefined1 *)local_710._M_allocated_capacity != local_700) {
    operator_delete((void *)local_710._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_f70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f70);
  }
  if (local_dc8 != local_db8) {
    operator_delete(local_dc8);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_da8._0_8_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(local_da8 + 0x10)) {
    operator_delete((void *)local_da8._0_8_);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1158._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1158 + 0x10)) {
    operator_delete((void *)local_1158._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_ba8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_ba8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_ba8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_ba8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f68._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f68 + 0x10)) {
    operator_delete((void *)local_f68._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_b98.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_b98.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((char *)local_e48._0_8_ != local_e38) {
    operator_delete((void *)local_e48._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_b88._12_4_,local_b88._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_b88._12_4_,local_b88._8_4_));
  }
  if ((char *)local_6f0._M_allocated_capacity != local_6e0) {
    operator_delete((void *)local_6f0._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1238._M_dataplus._M_p != &local_1238.field_2) {
    operator_delete(local_1238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_b78.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_b78.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_allocated_capacity != &local_1128) {
    operator_delete((void *)local_1138._M_allocated_capacity);
  }
  if ((__node_base *)local_2f0.m_keys._M_h._M_buckets != &local_2f0.m_keys._M_h._M_before_begin) {
    operator_delete(local_2f0.m_keys._M_h._M_buckets);
  }
  if ((__node_base *)local_f48._8_8_ != (__node_base *)(local_f38 + 8)) {
    operator_delete((void *)local_f48._8_8_);
  }
  if (local_11f0 != &local_11e0) {
    operator_delete(local_11f0);
  }
  local_f48._8_8_ = &local_1a8.m_positional;
  local_f18._0_8_ = auStack_ee8;
  local_f48._0_8_ =
       local_1a8.m_options.
       super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_f38 = (undefined1  [8])0x0;
  auStack_f30._0_8_ = (_Base_ptr)0x0;
  stack0xfffffffffffff0d8 = (_Base_ptr)0x0;
  bStack_f20 = local_1a8.m_allow_unrecognised;
  local_f18._8_8_ = 1;
  local_f18._16_8_ = (_Hash_node_base *)0x0;
  local_f18._24_8_ = 0;
  local_ef8._M_p = (pointer)0x3f800000;
  auStack_ee8._8_8_ = &p_Stack_eb0;
  sStack_ef0 = 0;
  auStack_ee8._0_8_ = (__node_base_ptr)0x0;
  _Stack_ed8._M_p = (pointer)0x1;
  local_ed0._M_nxt = (_Hash_node_base *)0x0;
  aStack_ec8._M_allocated_capacity = 0;
  aStack_ec8._8_8_ = 0x3f800000;
  local_eb8 = 0;
  p_Stack_eb0 = (__node_base_ptr)0x0;
  cxxopts::OptionParser::parse(&local_2f0,(OptionParser *)local_f48,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_ee8 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_f18);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_f38);
  local_f48._0_8_ = (Options *)local_f38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"help","");
  sVar15 = cxxopts::ParseResult::count(&local_2f0,(string *)local_f48);
  if ((Options *)local_f48._0_8_ != (Options *)local_f38) {
    operator_delete((void *)local_f48._0_8_);
  }
  if (sVar15 != 0) {
    local_1138._M_allocated_capacity = 0;
    local_1138._8_8_ = 0;
    local_1128._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_f48,&local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1138);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_f48._0_8_,local_f48._8_8_);
    std::endl<char,std::char_traits<char>>(poVar16);
    if ((Options *)local_f48._0_8_ != (Options *)local_f38) {
      operator_delete((void *)local_f48._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1138);
    this_00 = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this_00 = &PTR__exception_001918f8;
    pcVar19 = std::exception::~exception;
    ppuVar21 = &HelpException::typeinfo;
    goto LAB_0014a15c;
  }
  local_f48._0_8_ = (Options *)local_f38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"font-file","");
  sVar15 = cxxopts::ParseResult::count(&local_2f0,(string *)local_f48);
  if ((Options *)local_f48._0_8_ != (Options *)local_f38) {
    operator_delete((void *)local_f48._0_8_);
  }
  if (sVar15 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"--font-file required");
  }
  else {
    local_f48._0_8_ = (Options *)local_f38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"output","");
    sVar15 = cxxopts::ParseResult::count(&local_2f0,(string *)local_f48);
    if ((Options *)local_f48._0_8_ != (Options *)local_f38) {
      operator_delete((void *)local_f48._0_8_);
    }
    if (sVar15 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"--output required");
    }
    else {
      local_f48._0_8_ = (Options *)local_f38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"max-texture-count","");
      sVar15 = cxxopts::ParseResult::count(&local_2f0,(string *)local_f48);
      pCVar4->useMaxTextureCount = sVar15 != 0;
      if ((Options *)local_f48._0_8_ != (Options *)local_f38) {
        operator_delete((void *)local_f48._0_8_);
      }
      sVar15 = cxxopts::ParseResult::count(&local_2f0,&local_6b0);
      if ((sVar15 == 0) &&
         (sVar15 = cxxopts::ParseResult::count(&local_2f0,(string *)&local_d68), sVar15 == 0)) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_d48,0,(char *)local_d48._M_string_length,0x178cad);
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_d48._M_dataplus._M_p,
                 (char *)(local_d48._M_string_length + (long)local_d48._M_dataplus._M_p));
      parseCharsString((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_f48,&local_250);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&(pCVar4->chars)._M_t);
      if (local_f38 != (undefined1  [8])0x0) {
        (pCVar4->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_f48._8_4_;
        (pCVar4->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_f38;
        (pCVar4->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)auStack_f30._0_8_;
        (pCVar4->chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)stack0xfffffffffffff0d8;
        *(_Base_ptr *)((long)local_f38 + 8) = local_b60;
        (pCVar4->chars)._M_t._M_impl.super__Rb_tree_header._M_node_count = _bStack_f20;
        local_f38 = (undefined1  [8])0x0;
        _bStack_f20 = 0;
        auStack_f30._0_8_ = (_Base_ptr)(local_f48 + 8);
        unique0x10006269 = (_Base_ptr)(local_f48 + 8);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_f48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      sVar15 = cxxopts::ParseResult::count(&local_2f0,(string *)&local_d68);
      pbVar7 = local_ea8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      fileName = local_ea8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (sVar15 != 0) {
        for (; fileName != pbVar7; fileName = fileName + 1) {
          getCharsFromFile(fileName,&pCVar4->chars);
        }
      }
      CVar12 = parseColor(&local_310);
      (pCVar4->color).r = (char)CVar12._0_2_;
      (pCVar4->color).g = (char)((ushort)CVar12._0_2_ >> 8);
      (pCVar4->color).b = CVar12.b;
      sVar15 = cxxopts::ParseResult::count(&local_2f0,&local_690);
      pCVar4->backgroundTransparent = sVar15 == 0;
      if (sVar15 != 0) {
        CVar12 = parseColor(&local_350);
        (pCVar4->backgroundColor).r = (char)CVar12._0_2_;
        (pCVar4->backgroundColor).g = (char)((ushort)CVar12._0_2_ >> 8);
        (pCVar4->backgroundColor).b = CVar12.b;
      }
      sVar6 = local_11d0._M_string_length;
      _Var5._M_p = local_11d0._M_dataplus._M_p;
      if (local_11d0._M_string_length != 0) {
        sVar22 = 0;
        do {
          iVar13 = tolower((int)_Var5._M_p[sVar22]);
          _Var5._M_p[sVar22] = (char)iVar13;
          sVar22 = sVar22 + 1;
        } while (sVar6 != sVar22);
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_11d0);
      if (iVar13 == 0) {
        DVar17 = Text;
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)&local_11d0);
        if (iVar13 == 0) {
          DVar17 = Xml;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)&local_11d0);
          if (iVar13 == 0) {
            DVar17 = Bin;
          }
          else {
            iVar13 = std::__cxx11::string::compare((char *)&local_11d0);
            if (iVar13 == 0) {
              DVar17 = Json;
            }
            else {
              iVar13 = std::__cxx11::string::compare((char *)&local_11d0);
              DVar17 = Cbor;
              if (iVar13 != 0) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"unknown --data-format value");
                goto LAB_0014a14e;
              }
            }
          }
        }
      }
      sVar6 = local_1178._M_string_length;
      _Var5._M_p = local_1178._M_dataplus._M_p;
      pCVar4->dataFormat = DVar17;
      if (local_1178._M_string_length != 0) {
        sVar22 = 0;
        do {
          iVar13 = tolower((int)_Var5._M_p[sVar22]);
          _Var5._M_p[sVar22] = (char)iVar13;
          sVar22 = sVar22 + 1;
        } while (sVar6 != sVar22);
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_1178);
      TVar20 = IndexAligned;
      KVar18 = Disabled;
      if (iVar13 != 0) {
        iVar13 = std::__cxx11::string::compare((char *)&local_1178);
        if (iVar13 == 0) {
          KVar18 = Basic;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)&local_1178);
          if (iVar13 == 0) {
            KVar18 = Regular;
          }
          else {
            iVar13 = std::__cxx11::string::compare((char *)&local_1178);
            KVar18 = Extended;
            if (iVar13 != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"unknown --kerning-pairs value");
              goto LAB_0014a14e;
            }
          }
        }
      }
      pCVar4->kerningPairs = KVar18;
      iVar13 = std::__cxx11::string::compare((char *)&local_d88);
      if (iVar13 != 0) {
        iVar13 = std::__cxx11::string::compare((char *)&local_d88);
        if (iVar13 == 0) {
          TVar20 = Index;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)&local_d88);
          TVar20 = None;
          if (iVar13 != 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"unknown --texture-name-suffix value");
            goto LAB_0014a14e;
          }
        }
      }
      pCVar4->textureNameSuffix = TVar20;
      sVar15 = cxxopts::ParseResult::count(&local_2f0,&local_6d0);
      if (sVar15 == 0) {
        local_f48._0_8_ = (Options *)0x2000000020;
        local_f48._8_8_ = (pointer)0x2000000040;
        local_f38 = (undefined1  [8])0x4000000040;
        auStack_f30._0_8_ = (_Base_ptr)0x4000000080;
        stack0xfffffffffffff0d8 = (_Base_ptr)0x8000000080;
        _bStack_f20 = 0x8000000100;
        local_f18._0_8_ = (__buckets_ptr)0x10000000100;
        local_f18._8_8_ = 0x10000000200;
        local_f18._16_8_ = (_Hash_node_base *)0x20000000200;
        local_f18._24_8_ = 0x20000000400;
        local_ef8._M_p = (pointer)0x40000000400;
        sStack_ef0 = 0x40000000800;
        auStack_ee8._0_8_ = (__node_base_ptr)0x80000000800;
        std::vector<Config::Size,std::allocator<Config::Size>>::_M_assign_aux<Config::Size_const*>
                  ((vector<Config::Size,std::allocator<Config::Size>> *)&pCVar4->textureSizeList,
                   local_f48);
      }
      else {
        parseTextureSize((vector<Config::Size,_std::allocator<Config::Size>_> *)local_f48,&local_330
                        );
        pSVar3 = (pCVar4->textureSizeList).
                 super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (pCVar4->textureSizeList).super__Vector_base<Config::Size,_std::allocator<Config::Size>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_f48._0_8_;
        (pCVar4->textureSizeList).super__Vector_base<Config::Size,_std::allocator<Config::Size>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_f48._8_8_;
        (pCVar4->textureSizeList).super__Vector_base<Config::Size,_std::allocator<Config::Size>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f38;
        local_f48._0_8_ = (Options *)0x0;
        local_f48._8_8_ = (pointer)0x0;
        local_f38 = (undefined1  [8])0x0;
        if ((pSVar3 != (pointer)0x0) &&
           (operator_delete(pSVar3), (Options *)local_f48._0_8_ != (Options *)0x0)) {
          operator_delete((void *)local_f48._0_8_);
        }
      }
      if (*local_11b0 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"invalid --align-horiz");
      }
      else {
        if (local_b58->ver != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2f0.m_unmatched);
          std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
                    (&local_2f0.m_sequential);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_2f0.m_values._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_2f0);
          cxxopts::Options::~Options(&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
            operator_delete(local_d88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
            operator_delete(local_1178._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_11d0._M_dataplus._M_p != &local_11d0.field_2) {
            operator_delete(local_11d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
            operator_delete(local_6d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
            operator_delete(local_6b0._M_dataplus._M_p);
          }
          if ((char *)local_d68._M_allocated_capacity != local_d58) {
            operator_delete((void *)local_d68._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_690._M_dataplus._M_p != &local_690.field_2) {
            operator_delete(local_690._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_ea8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
            operator_delete(local_d48._M_dataplus._M_p);
          }
          return pCVar4;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"invalid --align-vert");
      }
    }
  }
LAB_0014a14e:
  pcVar19 = std::runtime_error::~runtime_error;
  ppuVar21 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
LAB_0014a15c:
  __cxa_throw(this_00,ppuVar21,pcVar19);
}

Assistant:

Config ProgramOptions::parseCommandLine(int argc, char* argv[])
{
    try
    {
        Config config;
        std::string chars;
        std::vector<std::string> charsFile;
        std::string color;
        std::string textureSizeList;
        std::string backgroundColor;
        const std::string backgroundColorOptionName = "background-color";
        const std::string charsFileOptionName = "chars-file";
        const std::string charsOptionName = "chars";
        const std::string textureSizeListOptionName = "texture-size";
        std::string dataFormat;
        std::string kerningPairs;
        std::string textureNameSuffix;

        cxxopts::Options options("fontbm", "Command line bitmap font generator, compatible with bmfont");
        options.add_options()
            ("help", "produce help message")
            ("font-file", "path to ttf file, required", cxxopts::value<std::string>(config.fontFile))
            (charsOptionName, "required characters, for example: 32-64,92,120-126\ndefault value is 32-126 if 'chars-file' option is not defined", cxxopts::value<std::string>(chars))
            (charsFileOptionName, "optional path to UTF-8 text file with required characters (will be combined with 'chars' option)", cxxopts::value<std::vector<std::string>>(charsFile))
            ("color", "foreground RGB color, for example: 32,255,255, default value is 255,255,255", cxxopts::value<std::string>(color)->default_value("255,255,255"))
            (backgroundColorOptionName, "background color RGB color, for example: 0,0,128, transparent by default", cxxopts::value<std::string>(backgroundColor))
            ("font-size", "font size, default value is 32", cxxopts::value<std::uint16_t>(config.fontSize)->default_value("32"))
            ("padding-up", "padding up, default value is 0", cxxopts::value<std::uint32_t>(config.padding.up)->default_value("0"))
            ("padding-right", "padding right, default value is 0", cxxopts::value<std::uint32_t>(config.padding.right)->default_value("0"))
            ("padding-down", "padding down, default value is 0", cxxopts::value<std::uint32_t>(config.padding.down)->default_value("0"))
            ("padding-left", "padding left, default value is 0", cxxopts::value<std::uint32_t>(config.padding.left)->default_value("0"))
            ("spacing-vert", "spacing vert, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.ver)->default_value("0"))
            ("spacing-horiz", "spacing horiz, default value is 0", cxxopts::value<std::uint32_t>(config.spacing.hor)->default_value("0"))
            ("output", "output files name without extension, required", cxxopts::value<std::string>(config.output))
            ("data-format", R"(output data file format: "txt", "xml", "json", "bin", "cbor", default: "txt")", cxxopts::value<std::string>(dataFormat)->default_value("txt"))
            ("kerning-pairs", R"("generate kerning pairs: "disabled", "basic", "regular" (tuned by hinter), "extended" (bigger output size, but more precise), default: "disabled")", cxxopts::value<std::string>(kerningPairs)->default_value("disabled"))
            ("monochrome", "disable anti-aliasing", cxxopts::value<bool>(config.monochrome))
            ("extra-info", "write extra information to data file", cxxopts::value<bool>(config.extraInfo))
            (textureSizeListOptionName, "list of texture sizes (will be tried from left to right to fit glyphs)", cxxopts::value<std::string>(textureSizeList))
            ("texture-crop-width", "crop unused parts of output textures (width)", cxxopts::value<bool>(config.cropTexturesWidth))
            ("texture-crop-height", "crop unused parts of output textures (height)", cxxopts::value<bool>(config.cropTexturesHeight))
            ("align-horiz", "align glyph horizontal position", cxxopts::value<std::uint32_t>(config.alignment.hor))
            ("align-vert", "align glyph vertical position", cxxopts::value<std::uint32_t>(config.alignment.ver))
            ("verbose", "verbose output", cxxopts::value<bool>(config.verbose))
            ("max-texture-count", "maximum generated textures", cxxopts::value<std::uint32_t>(config.maxTextureCount))
            ("texture-name-suffix", R"(texture name suffix: "index_aligned", "index", "none", default: "index_aligned")", cxxopts::value<std::string>(textureNameSuffix)->default_value("index_aligned"))
            ;

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            throw HelpException();
        }

        if (!result.count("font-file"))
            throw std::runtime_error("--font-file required");
        if (!result.count("output"))
            throw std::runtime_error("--output required");

        config.useMaxTextureCount = result.count("max-texture-count");

        if (!result.count(charsOptionName) && !result.count(charsFileOptionName))
            chars = "32-126";
        config.chars = parseCharsString(chars);
        if (result.count(charsFileOptionName))
            for (const auto& f : charsFile)
                getCharsFromFile(f, config.chars);

        config.color = parseColor(color);
        config.backgroundTransparent = result.count(backgroundColorOptionName) == 0;
        if (!config.backgroundTransparent)
            config.backgroundColor = parseColor(backgroundColor);

        std::transform(dataFormat.begin(), dataFormat.end(), dataFormat.begin(), tolower);

        if (dataFormat == "txt")
            config.dataFormat = Config::DataFormat::Text;
        else if (dataFormat == "xml")
            config.dataFormat = Config::DataFormat::Xml;
        else if (dataFormat == "bin")
            config.dataFormat = Config::DataFormat::Bin;
        else if (dataFormat == "json")
            config.dataFormat = Config::DataFormat::Json;
        else if (dataFormat == "cbor")
            config.dataFormat = Config::DataFormat::Cbor;
        else
            throw std::runtime_error("unknown --data-format value");

        std::transform(kerningPairs.begin(), kerningPairs.end(), kerningPairs.begin(), tolower);
        if (kerningPairs == "disabled")
            config.kerningPairs = Config::KerningPairs::Disabled;
        else if (kerningPairs == "basic")
            config.kerningPairs = Config::KerningPairs::Basic;
        else if (kerningPairs == "regular")
            config.kerningPairs = Config::KerningPairs::Regular;
        else if (kerningPairs == "extended")
            config.kerningPairs = Config::KerningPairs::Extended;
        else
            throw std::runtime_error("unknown --kerning-pairs value");

        if (textureNameSuffix == "index_aligned")
            config.textureNameSuffix = Config::TextureNameSuffix::IndexAligned;
        else if (textureNameSuffix == "index")
            config.textureNameSuffix = Config::TextureNameSuffix::Index;
        else if (textureNameSuffix == "none")
            config.textureNameSuffix = Config::TextureNameSuffix::None;
        else
            throw std::runtime_error("unknown --texture-name-suffix value");

        if (result.count(textureSizeListOptionName))
            config.textureSizeList = parseTextureSize(textureSizeList);
        else
            config.textureSizeList = {
                {32, 32},
                {64, 32},
                {64, 64},
                {128, 64},
                {128, 128},
                {256, 128},
                {256, 256},
                {512, 256},
                {512, 512},
                {1024, 512},
                {1024, 1024},
                {2048, 1024},
                {2048, 2048}
        };

        if (!config.alignment.hor)
            throw std::runtime_error("invalid --align-horiz");
        if (!config.alignment.ver)
            throw std::runtime_error("invalid --align-vert");

        return config;
    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        throw std::exception();
    }
}